

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec256.c
# Opt level: O1

void chacha20_core_256(Lib_IntVector_Intrinsics_vec256 *k,Lib_IntVector_Intrinsics_vec256 *ctx,
                      uint32_t ctr)

{
  Lib_IntVector_Intrinsics_vec256 alVar1;
  Lib_IntVector_Intrinsics_vec256 alVar2;
  Lib_IntVector_Intrinsics_vec256 alVar3;
  Lib_IntVector_Intrinsics_vec256 alVar4;
  Lib_IntVector_Intrinsics_vec256 alVar5;
  Lib_IntVector_Intrinsics_vec256 alVar6;
  Lib_IntVector_Intrinsics_vec256 alVar7;
  Lib_IntVector_Intrinsics_vec256 alVar8;
  Lib_IntVector_Intrinsics_vec256 alVar9;
  Lib_IntVector_Intrinsics_vec256 alVar10;
  Lib_IntVector_Intrinsics_vec256 alVar11;
  undefined1 auVar12 [32];
  Lib_IntVector_Intrinsics_vec256 alVar13;
  Lib_IntVector_Intrinsics_vec256 alVar14;
  Lib_IntVector_Intrinsics_vec256 alVar15;
  Lib_IntVector_Intrinsics_vec256 alVar16;
  Lib_IntVector_Intrinsics_vec256 alVar17;
  Lib_IntVector_Intrinsics_vec256 *os;
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  
  memcpy(k,ctx,0x200);
  iVar18 = ctr << 3;
  auVar19._4_4_ = iVar18;
  auVar19._0_4_ = iVar18;
  auVar19._8_4_ = iVar18;
  auVar19._12_4_ = iVar18;
  auVar19._16_4_ = iVar18;
  auVar19._20_4_ = iVar18;
  auVar19._24_4_ = iVar18;
  auVar19._28_4_ = iVar18;
  auVar20 = vpaddd_avx2(auVar19,(undefined1  [32])k[0xc]);
  auVar22 = vpaddd_avx2((undefined1  [32])k[4],(undefined1  [32])*k);
  auVar20 = vpshuflw_avx2(auVar22 ^ auVar20,0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2(auVar12,(undefined1  [32])k[8]);
  auVar21 = auVar20 ^ (undefined1  [32])k[4];
  auVar23 = vpsrld_avx2(auVar21,0x14);
  auVar21 = vpslld_avx2(auVar21,0xc);
  auVar21 = vpor_avx2(auVar21,auVar23);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar21,auVar22);
  *k = alVar1;
  auVar23._16_16_ = _DAT_001e57a0;
  auVar23._0_16_ = _DAT_001e57a0;
  auVar22 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar22);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar15);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar21,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar21,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])k[5],(undefined1  [32])k[1]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2(auVar12,(undefined1  [32])k[9]);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2(auVar22 ^ (undefined1  [32])alVar4,0x19);
  auVar20 = vpslld_avx2(auVar22 ^ (undefined1  [32])alVar4,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar21,auVar20);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])k[6],(undefined1  [32])k[2]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar13;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])k[10]);
  k[10] = alVar6;
  auVar20 = (undefined1  [32])alVar6 ^ (undefined1  [32])k[6];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar9 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar9;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar13,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  k[0xe] = alVar17;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar17);
  k[10] = alVar6;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar9,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar9,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])k[7],(undefined1  [32])k[3]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xf] = alVar14;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])k[0xb]);
  auVar20 = (undefined1  [32])k[7] ^ (undefined1  [32])alVar13;
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar20 ^ auVar22);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar1);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  k[10] = alVar6;
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar22 ^ auVar21);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ auVar20,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[10] = alVar6;
  k[5] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar3,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar8);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0xc);
  auVar20 = vpor_avx2(auVar20,auVar22);
  k[1] = alVar3;
  k[0xc] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar3);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[0xb] = alVar13;
  k[1] = alVar3;
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,auVar22 ^ auVar21);
  k[0xb] = alVar13;
  auVar22 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar13,0x19);
  auVar20 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar13,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar11);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar5,0xb1);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar10;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar2);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar11,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar11,0xc);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar10,auVar23);
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar22 ^ auVar20);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar9,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar8;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar8);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0xc);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar9);
  k[3] = alVar9;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar4,auVar22 ^ auVar20);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar7);
  *k = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar1 ^ (undefined1  [32])k[0xc],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar2,auVar12);
  auVar21 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar7,0x14);
  auVar22 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar7,0xc);
  auVar22 = vpor_avx2(auVar22,auVar21);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar20);
  k[8] = alVar2;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar22,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])k[5]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar4,auVar12);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar4 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ auVar22,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])k[6]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar6);
  auVar22 = auVar20 ^ (undefined1  [32])k[6];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar21,auVar22);
  k[0xe] = alVar11;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar10);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar11,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  k[6] = alVar10;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar17,auVar20);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[2] = alVar5;
  k[0xe] = alVar17;
  k[10] = alVar6;
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])k[7]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar20 = (undefined1  [32])alVar13 ^ (undefined1  [32])k[7];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[0xf] = alVar14;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar8);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  k[10] = alVar6;
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar22 ^ auVar21);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ auVar20,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[10] = alVar6;
  k[5] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar3,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar8);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[1] = alVar3;
  k[0xc] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar3);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[0xb] = alVar13;
  k[1] = alVar3;
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,auVar22 ^ auVar21);
  k[0xb] = alVar13;
  auVar22 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar13,0x19);
  auVar20 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar13,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar5,0xb1);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar10;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar2);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0xc);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar10,auVar23);
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar22 ^ auVar20);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar9,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar8;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar8);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0xc);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar9);
  k[3] = alVar9;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar4,auVar22 ^ auVar20);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar7);
  *k = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar1 ^ (undefined1  [32])k[0xc],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar2,auVar12);
  auVar21 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar7,0x14);
  auVar22 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar7,0xc);
  auVar22 = vpor_avx2(auVar22,auVar21);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar20);
  k[8] = alVar2;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar22,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])k[5]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar4,auVar12);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar4 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ auVar22,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])k[6]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar6);
  auVar22 = auVar20 ^ (undefined1  [32])k[6];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar21,auVar22);
  k[0xe] = alVar11;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar10);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar11,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  k[6] = alVar10;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar17,auVar20);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[2] = alVar5;
  k[0xe] = alVar17;
  k[10] = alVar6;
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])k[7]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar20 = (undefined1  [32])alVar13 ^ (undefined1  [32])k[7];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[0xf] = alVar14;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar8);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  k[10] = alVar6;
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar22 ^ auVar21);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ auVar20,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[10] = alVar6;
  k[5] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar3,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar8);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[1] = alVar3;
  k[0xc] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar3);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[0xb] = alVar13;
  k[1] = alVar3;
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,auVar22 ^ auVar21);
  k[0xb] = alVar13;
  auVar22 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar13,0x19);
  auVar20 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar13,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar5,0xb1);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar10;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar2);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0xc);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar10,auVar23);
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar22 ^ auVar20);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar9,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar8;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar8);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0xc);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar9);
  k[3] = alVar9;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar4,auVar22 ^ auVar20);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar7);
  *k = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar1 ^ (undefined1  [32])k[0xc],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar2,auVar12);
  auVar21 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar7,0x14);
  auVar22 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar7,0xc);
  auVar22 = vpor_avx2(auVar22,auVar21);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar20);
  k[8] = alVar2;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar22,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])k[5]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar4,auVar12);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar4 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ auVar22,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])k[6]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar6);
  auVar22 = auVar20 ^ (undefined1  [32])k[6];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar21,auVar22);
  k[0xe] = alVar11;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar10);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar11,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  k[6] = alVar10;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar17,auVar20);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[2] = alVar5;
  k[0xe] = alVar17;
  k[10] = alVar6;
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])k[7]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar20 = (undefined1  [32])alVar13 ^ (undefined1  [32])k[7];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[0xf] = alVar14;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar8);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  k[10] = alVar6;
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar22 ^ auVar21);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ auVar20,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[10] = alVar6;
  k[5] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar3,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar8);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[1] = alVar3;
  k[0xc] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar3);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[0xb] = alVar13;
  k[1] = alVar3;
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,auVar22 ^ auVar21);
  k[0xb] = alVar13;
  auVar22 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar13,0x19);
  auVar20 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar13,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar5,0xb1);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar10;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar2);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0xc);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar10,auVar23);
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar22 ^ auVar20);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar9,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar8;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar8);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0xc);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar9);
  k[3] = alVar9;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar4,auVar22 ^ auVar20);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar7);
  *k = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar1 ^ (undefined1  [32])k[0xc],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar2,auVar12);
  auVar21 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar7,0x14);
  auVar22 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar7,0xc);
  auVar22 = vpor_avx2(auVar22,auVar21);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar20);
  k[8] = alVar2;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar22,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])k[5]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar4,auVar12);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar4 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ auVar22,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])k[6]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar6);
  auVar22 = auVar20 ^ (undefined1  [32])k[6];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar21,auVar22);
  k[0xe] = alVar11;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar10);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar11,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  k[6] = alVar10;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar17,auVar20);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[2] = alVar5;
  k[0xe] = alVar17;
  k[10] = alVar6;
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])k[7]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar20 = (undefined1  [32])alVar13 ^ (undefined1  [32])k[7];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[0xf] = alVar14;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar8);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  k[10] = alVar6;
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar22 ^ auVar21);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ auVar20,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[10] = alVar6;
  k[5] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar3,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar8);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[1] = alVar3;
  k[0xc] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar3);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[0xb] = alVar13;
  k[1] = alVar3;
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,auVar22 ^ auVar21);
  k[0xb] = alVar13;
  auVar22 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar13,0x19);
  auVar20 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar13,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar5,0xb1);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar10;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar2);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0xc);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar10,auVar23);
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar22 ^ auVar20);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar9,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar8;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar8);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0xc);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar9);
  k[3] = alVar9;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar4,auVar22 ^ auVar20);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar7);
  *k = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar1 ^ (undefined1  [32])k[0xc],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar2,auVar12);
  auVar21 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar7,0x14);
  auVar22 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar7,0xc);
  auVar22 = vpor_avx2(auVar22,auVar21);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar20);
  k[8] = alVar2;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar22,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])k[5]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar4,auVar12);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar4 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ auVar22,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])k[6]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar6);
  auVar22 = auVar20 ^ (undefined1  [32])k[6];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar21,auVar22);
  k[0xe] = alVar11;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar10);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar11,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  k[6] = alVar10;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar17,auVar20);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[2] = alVar5;
  k[0xe] = alVar17;
  k[10] = alVar6;
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])k[7]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar20 = (undefined1  [32])alVar13 ^ (undefined1  [32])k[7];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[0xf] = alVar14;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar8);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  k[10] = alVar6;
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar22 ^ auVar21);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ auVar20,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[10] = alVar6;
  k[5] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar3,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar8);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[1] = alVar3;
  k[0xc] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar3);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[0xb] = alVar13;
  k[1] = alVar3;
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,auVar22 ^ auVar21);
  k[0xb] = alVar13;
  auVar22 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar13,0x19);
  auVar20 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar13,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar5,0xb1);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar10;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar2);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0xc);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar10,auVar23);
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar22 ^ auVar20);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar9,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar8;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar4);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0xc);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar9);
  k[3] = alVar9;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar4,auVar22 ^ auVar20);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar7);
  *k = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar1 ^ (undefined1  [32])k[0xc],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar2,auVar12);
  auVar21 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar7,0x14);
  auVar22 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar7,0xc);
  auVar22 = vpor_avx2(auVar22,auVar21);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar20);
  k[8] = alVar2;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar22,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])k[5]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar4,auVar12);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar4 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ auVar22,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])k[6]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar6);
  auVar22 = auVar20 ^ (undefined1  [32])k[6];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar21,auVar22);
  k[0xe] = alVar11;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar10);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar11,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  k[6] = alVar10;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar17,auVar20);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[2] = alVar5;
  k[0xe] = alVar17;
  k[10] = alVar6;
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])k[7]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar20 = (undefined1  [32])alVar13 ^ (undefined1  [32])k[7];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[0xf] = alVar14;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar8);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  k[10] = alVar6;
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar22 ^ auVar21);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ auVar20,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[10] = alVar6;
  k[5] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar3,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar8);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[1] = alVar3;
  k[0xc] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar3);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[0xb] = alVar13;
  k[1] = alVar3;
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,auVar22 ^ auVar21);
  k[0xb] = alVar13;
  auVar22 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar13,0x19);
  auVar20 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar13,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar5,0xb1);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar10;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar10);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0xc);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar10,auVar23);
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar22 ^ auVar20);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar9,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar8;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar4);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0xc);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar9);
  k[3] = alVar9;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar4,auVar22 ^ auVar20);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar7);
  *k = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar1 ^ (undefined1  [32])k[0xc],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar2,auVar12);
  auVar21 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar7,0x14);
  auVar22 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar7,0xc);
  auVar22 = vpor_avx2(auVar22,auVar21);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar20);
  k[8] = alVar2;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar22,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])k[5]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar4,auVar12);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar4 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ auVar22,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])k[6]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar6);
  auVar22 = auVar20 ^ (undefined1  [32])k[6];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar21,auVar22);
  k[0xe] = alVar11;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar10);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar11,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  k[6] = alVar10;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar17,auVar20);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[2] = alVar5;
  k[0xe] = alVar17;
  k[10] = alVar6;
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])k[7]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar20 = (undefined1  [32])alVar13 ^ (undefined1  [32])k[7];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[0xf] = alVar14;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar8);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  k[10] = alVar6;
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar22 ^ auVar21);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ auVar20,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[10] = alVar6;
  k[5] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar3,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar8);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[1] = alVar3;
  k[0xc] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar3);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[0xb] = alVar13;
  k[1] = alVar3;
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,auVar22 ^ auVar21);
  k[0xb] = alVar13;
  auVar22 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar13,0x19);
  auVar20 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar13,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar5,0xb1);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar10;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar10);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0xc);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar10,auVar23);
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar22 ^ auVar20);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar9,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar8;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar4);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0xc);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar9);
  k[3] = alVar9;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar4,auVar22 ^ auVar20);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar7);
  *k = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar1 ^ (undefined1  [32])k[0xc],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar2,auVar12);
  auVar21 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar7,0x14);
  auVar22 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar7,0xc);
  auVar22 = vpor_avx2(auVar22,auVar21);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar20);
  k[8] = alVar2;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar22,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])k[5]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar4,auVar12);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar4 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ auVar22,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])k[6]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar6);
  auVar22 = auVar20 ^ (undefined1  [32])k[6];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar21,auVar22);
  k[0xe] = alVar11;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar10);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar11,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  k[6] = alVar10;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar17,auVar20);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[2] = alVar5;
  k[0xe] = alVar17;
  k[10] = alVar6;
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])k[7]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar20 = (undefined1  [32])alVar13 ^ (undefined1  [32])k[7];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[0xf] = alVar14;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar8);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  k[10] = alVar6;
  *k = alVar1;
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar22 ^ auVar21);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ auVar20,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[10] = alVar6;
  k[5] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar3,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar8);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar13,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[1] = alVar3;
  k[0xc] = alVar8;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar3);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[0xb] = alVar13;
  k[1] = alVar3;
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,auVar22 ^ auVar21);
  k[0xb] = alVar13;
  auVar22 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar13,0x19);
  auVar20 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar13,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar5,0xb1);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar10;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar2);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0xc);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar5);
  k[2] = alVar5;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar10,auVar23);
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar22 ^ auVar20);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ (undefined1  [32])alVar8,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar8;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar9,0xb1);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xe] = alVar8;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar4);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0xc);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar9);
  k[3] = alVar9;
  auVar20 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar8,auVar23);
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar20);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar4,auVar22 ^ auVar20);
  k[9] = alVar4;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ (undefined1  [32])alVar7,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar7;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar7);
  *k = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar1 ^ (undefined1  [32])k[0xc],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar2,auVar12);
  auVar21 = vpsrld_avx2(auVar20 ^ (undefined1  [32])alVar7,0x14);
  auVar22 = vpslld_avx2(auVar20 ^ (undefined1  [32])alVar7,0xc);
  auVar22 = vpor_avx2(auVar22,auVar21);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar15 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xc] = alVar15;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar15,auVar20);
  k[8] = alVar2;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar22,7);
  alVar7 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[4] = alVar7;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])k[5]);
  k[1] = alVar3;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])k[0xd],0xb1);
  auVar12 = vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar4,auVar12);
  auVar22 = auVar20 ^ (undefined1  [32])k[5];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  auVar22 = vpor_avx2(auVar21,auVar22);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar22,(undefined1  [32])alVar3);
  k[1] = alVar3;
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  auVar12 = vpshufb_avx2(auVar12,auVar23);
  alVar16 = (Lib_IntVector_Intrinsics_vec256)(auVar12 ^ auVar21);
  k[0xd] = alVar16;
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar16);
  k[9] = alVar4;
  auVar21 = vpsrld_avx2((undefined1  [32])alVar4 ^ auVar22,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar4 ^ auVar22,7);
  alVar8 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar21);
  k[5] = alVar8;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])k[6]);
  k[2] = alVar5;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar5 ^ (undefined1  [32])k[0xe],0xb1);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  auVar20 = vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar6);
  auVar22 = auVar20 ^ (undefined1  [32])k[6];
  auVar21 = vpsrld_avx2(auVar22,0x14);
  auVar22 = vpslld_avx2(auVar22,0xc);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar21);
  k[0xe] = alVar11;
  alVar5 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar10);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar11,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  alVar17 = (Lib_IntVector_Intrinsics_vec256)(auVar21 ^ auVar22);
  k[6] = alVar10;
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar17);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar10,7);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar22,auVar20);
  k[2] = alVar5;
  k[0xe] = alVar17;
  k[10] = alVar6;
  k[6] = alVar10;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])k[7]);
  k[3] = alVar9;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar9 ^ (undefined1  [32])k[0xf],0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar13);
  auVar20 = (undefined1  [32])alVar13 ^ (undefined1  [32])k[7];
  auVar22 = vpsrld_avx2(auVar20,0x14);
  auVar20 = vpslld_avx2(auVar20,0xc);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[0xf] = alVar14;
  alVar9 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar11);
  auVar20 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar9,auVar23);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)(auVar20 ^ auVar22);
  k[0xb] = alVar13;
  k[7] = alVar11;
  alVar13 = (Lib_IntVector_Intrinsics_vec256)
            vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar13 ^ (undefined1  [32])alVar11,7);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[3] = alVar9;
  k[0xf] = alVar14;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar8);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar14 ^ (undefined1  [32])alVar1,0xb1);
  alVar14 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar14);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar6 ^ (undefined1  [32])alVar8,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[0xb] = alVar13;
  k[7] = alVar11;
  *k = alVar1;
  k[0xf] = alVar14;
  k[10] = alVar6;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  *k = alVar1;
  auVar22 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar14,auVar23);
  k[0xf] = (Lib_IntVector_Intrinsics_vec256)(auVar21 ^ auVar22);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar6,auVar21 ^ auVar22);
  k[10] = alVar1;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar1 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar1 ^ auVar20,7);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[5] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar3);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar15 ^ (undefined1  [32])alVar1,0xb1);
  alVar6 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar6);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar3,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar10 ^ (undefined1  [32])alVar3,0xc);
  auVar20 = vpor_avx2(auVar22,auVar20);
  k[1] = alVar1;
  k[0xc] = alVar6;
  k[0xb] = alVar3;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  k[1] = alVar1;
  auVar22 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar6,auVar23);
  k[0xc] = (Lib_IntVector_Intrinsics_vec256)(auVar21 ^ auVar22);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar3,auVar21 ^ auVar22);
  k[0xb] = alVar1;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar1 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar1 ^ auVar20,7);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[6] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar5);
  k[2] = alVar1;
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar16 ^ (undefined1  [32])alVar1,0xb1);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  k[0xd] = alVar3;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar2);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar11 ^ (undefined1  [32])alVar2,0xc);
  auVar20 = vpor_avx2(auVar20,auVar22);
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar1);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar1,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar3,auVar23);
  k[8] = alVar2;
  k[2] = alVar1;
  k[0xd] = (Lib_IntVector_Intrinsics_vec256)(auVar21 ^ auVar22);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar2,auVar21 ^ auVar22);
  k[8] = alVar2;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar2 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar2 ^ auVar20,7);
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[7] = alVar2;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar7);
  auVar20 = vpshuflw_avx2((undefined1  [32])alVar17 ^ (undefined1  [32])alVar2,0xb1);
  alVar5 = (Lib_IntVector_Intrinsics_vec256)vpshufhw_avx2(auVar20,0xb1);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar4);
  auVar22 = vpsrld_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])alVar7,0x14);
  auVar20 = vpslld_avx2((undefined1  [32])alVar3 ^ (undefined1  [32])alVar7,0xc);
  auVar20 = vpor_avx2(auVar20,auVar22);
  k[3] = alVar2;
  k[0xe] = alVar5;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2(auVar20,(undefined1  [32])alVar2);
  auVar22 = vpshufb_avx2((undefined1  [32])alVar5,auVar23);
  auVar21 = vpshufb_avx2((undefined1  [32])alVar2,auVar23);
  k[9] = alVar3;
  k[3] = alVar2;
  k[0xe] = (Lib_IntVector_Intrinsics_vec256)(auVar22 ^ auVar21);
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar3,auVar22 ^ auVar21);
  k[9] = alVar3;
  auVar22 = vpsrld_avx2((undefined1  [32])alVar3 ^ auVar20,0x19);
  auVar20 = vpslld_avx2((undefined1  [32])alVar3 ^ auVar20,7);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpor_avx2(auVar20,auVar22);
  k[4] = alVar4;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])*ctx,(undefined1  [32])*k)
  ;
  *k = alVar3;
  alVar3 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[1],(undefined1  [32])k[1]);
  k[1] = alVar3;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar1,(undefined1  [32])ctx[2]);
  k[2] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar2,(undefined1  [32])ctx[3]);
  k[3] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])alVar4,(undefined1  [32])ctx[4]);
  k[4] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[5],(undefined1  [32])k[5]);
  k[5] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[6],(undefined1  [32])k[6]);
  k[6] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[7],(undefined1  [32])k[7]);
  k[7] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[8],(undefined1  [32])k[8]);
  k[8] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[9],(undefined1  [32])k[9]);
  k[9] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[10],(undefined1  [32])k[10]);
  k[10] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xb],(undefined1  [32])k[0xb]);
  k[0xb] = alVar1;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xc],(undefined1  [32])k[0xc]);
  k[0xc] = alVar1;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xd],(undefined1  [32])k[0xd]);
  k[0xd] = alVar2;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xe],(undefined1  [32])k[0xe]);
  k[0xe] = alVar2;
  alVar2 = (Lib_IntVector_Intrinsics_vec256)
           vpaddd_avx2((undefined1  [32])ctx[0xf],(undefined1  [32])k[0xf]);
  k[0xf] = alVar2;
  alVar1 = (Lib_IntVector_Intrinsics_vec256)vpaddd_avx2((undefined1  [32])alVar1,auVar19);
  k[0xc] = alVar1;
  return;
}

Assistant:

static inline void
chacha20_core_256(
  Lib_IntVector_Intrinsics_vec256 *k,
  Lib_IntVector_Intrinsics_vec256 *ctx,
  uint32_t ctr
)
{
  memcpy(k, ctx, 16U * sizeof (Lib_IntVector_Intrinsics_vec256));
  uint32_t ctr_u32 = 8U * ctr;
  Lib_IntVector_Intrinsics_vec256 cv = Lib_IntVector_Intrinsics_vec256_load32(ctr_u32);
  k[12U] = Lib_IntVector_Intrinsics_vec256_add32(k[12U], cv);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    Lib_IntVector_Intrinsics_vec256 *os = k;
    Lib_IntVector_Intrinsics_vec256 x = Lib_IntVector_Intrinsics_vec256_add32(k[i], ctx[i]);
    os[i] = x;);
  k[12U] = Lib_IntVector_Intrinsics_vec256_add32(k[12U], cv);
}